

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O1

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *this,string *id,
          FluctuatingAtypeParameters *data)

{
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  RealType RVar4;
  RealType RVar5;
  bool bVar6;
  bool bVar7;
  undefined6 uVar8;
  int iVar9;
  undefined4 uVar10;
  
  GenericData::GenericData(&this->super_GenericData,id);
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_00301358;
  bVar6 = data->isMetallic;
  bVar7 = data->usesSlaterIntramolecular;
  uVar8 = *(undefined6 *)&data->field_0xa;
  RVar1 = data->nValence;
  RVar2 = data->nMobile;
  RVar3 = data->electronegativity;
  RVar4 = data->hardness;
  iVar9 = data->slaterN;
  uVar10 = *(undefined4 *)&data->field_0x34;
  RVar5 = data->slaterZeta;
  (this->data_).chargeMass = data->chargeMass;
  (this->data_).isMetallic = bVar6;
  (this->data_).usesSlaterIntramolecular = bVar7;
  *(undefined6 *)&(this->data_).field_0xa = uVar8;
  (this->data_).nValence = RVar1;
  (this->data_).nMobile = RVar2;
  (this->data_).electronegativity = RVar3;
  (this->data_).hardness = RVar4;
  (this->data_).slaterN = iVar9;
  *(undefined4 *)&(this->data_).field_0x34 = uVar10;
  (this->data_).slaterZeta = RVar5;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)&(this->data_).vself,
             (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)&data->vself);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}